

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-options.c
# Opt level: O3

void ui_keymap_remove(char *title,wchar_t row)

{
  _Bool _Var1;
  char *str;
  keypress kVar2;
  keypress trigger;
  
  _Var1 = (player->opts).opt[1];
  prt(title,L'\r',L'\0');
  prt("Key: ",L'\x0e',L'\0');
  kVar2 = keymap_get_trigger();
  trigger._8_4_ = kVar2._8_4_ & 0xff;
  trigger.type = (int)kVar2._0_8_;
  trigger.code = (int)((ulong)kVar2._0_8_ >> 0x20);
  _Var1 = keymap_remove((uint)_Var1,trigger);
  str = "No keymap to remove!";
  if (_Var1) {
    str = "Removed.";
  }
  prt(str,L'\x10',L'\0');
  prt("Press any key to continue.",L'\x11',L'\0');
  inkey();
  return;
}

Assistant:

static void ui_keymap_remove(const char *title, int row)
{
	struct keypress c;
	int mode = OPT(player, rogue_like_commands) ? KEYMAP_MODE_ROGUE : KEYMAP_MODE_ORIG;

	prt(title, 13, 0);
	prt("Key: ", 14, 0);

	c = keymap_get_trigger();

	if (keymap_remove(mode, c))
		prt("Removed.", 16, 0);
	else
		prt("No keymap to remove!", 16, 0);

	/* Prompt */
	prt("Press any key to continue.", 17, 0);
	inkey();
}